

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_sock_write_from_fd(int fd,fio_packet_s *packet)

{
  long lVar1;
  ssize_t sVar2;
  int *piVar3;
  uintptr_t __offset;
  uintptr_t uVar4;
  ulong __nbytes;
  long lVar5;
  long lStack_c050;
  char buff [49152];
  
  uVar4 = packet->length;
  lVar1 = (long)fd * 0xa8;
  lVar5 = 0;
  while( true ) {
    __offset = packet->offset + lVar5;
    packet->offset = __offset;
    __nbytes = uVar4 - lVar5;
    packet->length = __nbytes;
    while( true ) {
      if (0xbfff < __nbytes) {
        __nbytes = 0xc000;
      }
      sVar2 = pread(*(int *)&packet->data,buff,__nbytes,__offset);
      if (0 < sVar2) break;
      if (lVar5 == 0) goto LAB_001285d7;
      piVar3 = __errno_location();
      if ((*piVar3 != 0xb) && (*piVar3 != 4)) {
        lStack_c050 = -1;
        goto LAB_001285e4;
      }
      __offset = packet->offset;
      __nbytes = packet->length;
    }
    lStack_c050 = (**(code **)(*(long *)((long)fio_data + lVar1 + 0xa8) + 8))
                            ((long)CONCAT41(fd,*(undefined1 *)((long)fio_data + lVar1 + 0x6d)),
                             *(undefined8 *)((long)fio_data + lVar1 + 0xb0),buff);
    if (lStack_c050 != sVar2) break;
    uVar4 = packet->length;
    lVar5 = sVar2;
    if (uVar4 == 0) {
      uVar4 = 0;
      lStack_c050 = sVar2;
LAB_001285ca:
      packet->offset = packet->offset + lStack_c050;
      packet->length = uVar4 - lStack_c050;
      if (uVar4 - lStack_c050 == 0) {
LAB_001285d7:
        fio_sock_packet_rotate_unsafe((long)fd);
        lStack_c050 = 1;
      }
LAB_001285e4:
      return (int)lStack_c050;
    }
  }
  if (lStack_c050 < 0) {
    lStack_c050 = 0;
    goto LAB_001285e4;
  }
  uVar4 = packet->length;
  goto LAB_001285ca;
}

Assistant:

static int fio_sock_write_from_fd(int fd, fio_packet_s *packet) {
  ssize_t asked = 0;
  ssize_t sent = 0;
  ssize_t total = 0;
  char buff[BUFFER_FILE_READ_SIZE];
  do {
    packet->offset += sent;
    packet->length -= sent;
  retry:
    asked = pread(packet->data.fd, buff,
                  ((packet->length < BUFFER_FILE_READ_SIZE)
                       ? packet->length
                       : BUFFER_FILE_READ_SIZE),
                  packet->offset);
    if (asked <= 0)
      goto read_error;
    sent = fd_data(fd).rw_hooks->write(fd2uuid(fd), fd_data(fd).rw_udata, buff,
                                       asked);
  } while (sent == asked && packet->length);
  if (sent >= 0) {
    packet->offset += sent;
    packet->length -= sent;
    total += sent;
    if (!packet->length) {
      fio_sock_packet_rotate_unsafe(fd);
      return 1;
    }
  }
  return total;

read_error:
  if (sent == 0) {
    fio_sock_packet_rotate_unsafe(fd);
    return 1;
  }
  if (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR)
    goto retry;
  return -1;
}